

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O1

void * dexpand(int_t *prev_len,MemType type,int_t len_to_copy,int keep_prev,GlobalLU_t *Glu)

{
  int iVar1;
  ExpHeader *pEVar2;
  char *src;
  void *old;
  int iVar3;
  int_t *piVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  void *pvVar10;
  MemType MVar11;
  int iVar12;
  double *dnew;
  float fVar13;
  float local_3c;
  
  pEVar2 = Glu->expanders;
  iVar3 = *prev_len;
  iVar7 = (int)((float)iVar3 * 1.5);
  if (Glu->num_expansions == 0) {
    iVar7 = iVar3;
  }
  if (keep_prev != 0) {
    iVar7 = iVar3;
  }
  MVar11 = type & ~UCOL;
  if (Glu->MemModel == SYSTEM) {
    pvVar10 = superlu_malloc((long)iVar7 << (MVar11 == LSUB ^ 3U));
    if (Glu->num_expansions != 0) {
      if (keep_prev == 0) {
        if (pvVar10 == (void *)0x0) {
          local_3c = 1.5;
          iVar3 = 0xb;
          do {
            iVar3 = iVar3 + -1;
            if (iVar3 == 0) {
              return (void *)0x0;
            }
            local_3c = (local_3c + 1.0) * 0.5;
            iVar7 = (int)((float)*prev_len * local_3c);
            pvVar10 = superlu_malloc((long)iVar7 << (MVar11 == LSUB ^ 3U));
          } while (pvVar10 == (void *)0x0);
        }
      }
      else if (pvVar10 == (void *)0x0) {
        return (void *)0x0;
      }
      old = pEVar2[type].mem;
      if (MVar11 == LSUB) {
        copy_mem_int(len_to_copy,old,pvVar10);
      }
      else if (0 < len_to_copy) {
        uVar6 = 0;
        do {
          *(undefined8 *)((long)pvVar10 + uVar6 * 8) = *(undefined8 *)((long)old + uVar6 * 8);
          uVar6 = uVar6 + 1;
        } while ((uint)len_to_copy != uVar6);
      }
      superlu_free(pEVar2[type].mem);
    }
    pEVar2[type].mem = pvVar10;
  }
  else if (Glu->num_expansions == 0) {
    iVar5 = iVar7 << (MVar11 == LSUB ^ 3U);
    iVar3 = (Glu->stack).used + iVar5;
    if (iVar3 < (Glu->stack).size) {
      iVar12 = (Glu->stack).top1;
      pvVar10 = (void *)((long)iVar12 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar5 + iVar12;
      (Glu->stack).used = iVar3;
    }
    else {
      pvVar10 = (void *)0x0;
    }
    if ((type < LSUB) && (iVar3 = (int)pvVar10, ((ulong)pvVar10 & 7) != 0)) {
      uVar6 = (long)pvVar10 + 7;
      pvVar10 = (void *)(uVar6 & 0xfffffffffffffff8);
      iVar3 = ((uint)uVar6 & 0xfffffff8) - iVar3;
      piVar4 = &(Glu->stack).top1;
      *piVar4 = *piVar4 + iVar3;
      piVar4 = &(Glu->stack).used;
      *piVar4 = *piVar4 + iVar3;
    }
    pEVar2[type].mem = pvVar10;
  }
  else {
    iVar3 = *prev_len;
    iVar12 = iVar7 - iVar3 << (MVar11 == LSUB ^ 3U);
    iVar5 = (Glu->stack).used;
    if (keep_prev == 0) {
      iVar1 = (Glu->stack).size;
      if (iVar1 <= iVar5 + iVar12) {
        fVar13 = 1.5;
        iVar8 = 0xb;
        do {
          iVar8 = iVar8 + -1;
          if (iVar8 == 0) {
            return (void *)0x0;
          }
          fVar13 = (fVar13 + 1.0) * 0.5;
          iVar7 = (int)(fVar13 * (float)iVar3);
          iVar12 = iVar7 - iVar3 << (MVar11 == LSUB ^ 3U);
        } while (iVar1 <= iVar5 + iVar12);
      }
    }
    else if ((Glu->stack).size <= iVar5 + iVar12) {
      return (void *)0x0;
    }
    if (type != USUB) {
      src = (char *)pEVar2[type + UCOL].mem;
      lVar9 = (long)iVar12;
      user_bcopy(src,src + lVar9,(*(int *)&(Glu->stack).array + (Glu->stack).top1) - (int)src);
      if (type < USUB) {
        piVar4 = (int_t *)((long)pEVar2[3].mem + lVar9);
        pEVar2[3].mem = piVar4;
        Glu->usub = piVar4;
      }
      if (type < LSUB) {
        piVar4 = (int_t *)((long)pEVar2[2].mem + lVar9);
        pEVar2[2].mem = piVar4;
        Glu->lsub = piVar4;
      }
      if (type == LUSUP) {
        pvVar10 = (void *)(lVar9 + (long)pEVar2[1].mem);
        pEVar2[1].mem = pvVar10;
        Glu->ucol = pvVar10;
      }
      iVar3 = (Glu->stack).top1 + iVar12;
      (Glu->stack).top1 = iVar3;
      iVar5 = (Glu->stack).used + iVar12;
      (Glu->stack).used = iVar5;
      if (type == UCOL) {
        (Glu->stack).top1 = iVar3 + iVar12;
        (Glu->stack).used = iVar5 + iVar12;
      }
    }
  }
  pEVar2[type].size = iVar7;
  *prev_len = iVar7;
  if (Glu->num_expansions != 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
  }
  return pEVar2[type].mem;
}

Assistant:

void
*dexpand (
	 int_t *prev_len,   /* length used from previous call */
	 MemType type,    /* which part of the memory to expand */
	 int_t len_to_copy, /* size of the memory to be copied to new store */
	 int keep_prev,   /* = 1: use prev_len;
			     = 0: compute new_len to expand */
	 GlobalLU_t *Glu  /* modified - global LU data structures */
	)
{
    float    EXPAND = 1.5;
    float    alpha;
    void     *new_mem, *old_mem;
    int_t    new_len, bytes_to_copy;
    int      tries, lword, extra;
    ExpHeader *expanders = Glu->expanders; /* Array of 4 types of memory */

    alpha = EXPAND;

    if ( Glu->num_expansions == 0 || keep_prev ) {
        /* First time allocate requested */
        new_len = *prev_len;
    } else {
	new_len = alpha * *prev_len;
    }
    
    if ( type == LSUB || type == USUB ) lword = sizeof(int_t);
    else lword = sizeof(double);

    if ( Glu->MemModel == SYSTEM ) {
	new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
	if ( Glu->num_expansions != 0 ) {
	    tries = 0;
	    if ( keep_prev ) {
		if ( !new_mem ) return (NULL);
	    } else {
		while ( !new_mem ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
		}
	    }
	    if ( type == LSUB || type == USUB ) {
		copy_mem_int(len_to_copy, expanders[type].mem, new_mem);
	    } else {
		copy_mem_double(len_to_copy, expanders[type].mem, new_mem);
	    }
	    SUPERLU_FREE (expanders[type].mem);
	}
	expanders[type].mem = (void *) new_mem;
	
    } else { /* MemModel == USER */
    
	if ( Glu->num_expansions == 0 ) { /* First time initialization */
	
	    new_mem = duser_malloc(new_len * lword, HEAD, Glu);
	    if ( NotDoubleAlign(new_mem) &&
		(type == LUSUP || type == UCOL) ) {
		old_mem = new_mem;
		new_mem = (void *)DoubleAlign(new_mem);
		extra = (char*)new_mem - (char*)old_mem;
#if ( DEBUGlevel>=1 )
		printf("expand(): not aligned, extra %d\n", extra);
#endif		
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
	    }
	    
	    expanders[type].mem = (void *) new_mem;
	    
	} else { /* CASE: num_expansions != 0 */
	
	    tries = 0;
	    extra = (new_len - *prev_len) * lword;
	    if ( keep_prev ) {
		if ( StackFull(extra) ) return (NULL);
	    } else {
		while ( StackFull(extra) ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    extra = (new_len - *prev_len) * lword;	    
		}
	    }

	      /* Need to expand the memory: moving the content after the current MemType
	      	 to make extra room for the current MemType.
              	 Memory layout: [ LUSUP || UCOL || LSUB || USUB ]
	      */
  	    if ( type != USUB ) {
		new_mem = (void*)((char*)expanders[type + 1].mem + extra);
		bytes_to_copy = (char*)Glu->stack.array + Glu->stack.top1
		    - (char*)expanders[type + 1].mem;
		user_bcopy(expanders[type+1].mem, new_mem, bytes_to_copy);

		if ( type < USUB ) {
		    Glu->usub = expanders[USUB].mem =
			(void*)((char*)expanders[USUB].mem + extra);
		}
		if ( type < LSUB ) {
		    Glu->lsub = expanders[LSUB].mem =
			(void*)((char*)expanders[LSUB].mem + extra);
		}
		if ( type < UCOL ) {
		    Glu->ucol = expanders[UCOL].mem =
			(void*)((char*)expanders[UCOL].mem + extra);
		}
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
		if ( type == UCOL ) {
		    Glu->stack.top1 += extra;   /* Add same amount for USUB */
		    Glu->stack.used += extra;
		}
		
	    } /* end expansion */

	} /* else ... */
    }

    expanders[type].size = new_len;
    *prev_len = new_len;
    if ( Glu->num_expansions ) ++Glu->num_expansions;
    
    return (void *) expanders[type].mem;
    
}